

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::deleteLater(Client *this)

{
  ulong uVar1;
  long *in_RDI;
  
  if (in_RDI[2] != 0) {
    in_RDI[2] = 0;
    uVar1 = (**(code **)(*in_RDI + 0x10))();
    if ((uVar1 & 1) == 0) {
      Storage<xmrig::Client>::remove((Storage<xmrig::Client> *)m_storage,(char *)in_RDI[0x95a]);
    }
  }
  return;
}

Assistant:

void xmrig::Client::deleteLater()
{
    if (!m_listener) {
        return;
    }

    m_listener = nullptr;

    if (!disconnect()) {
        m_storage.remove(m_key);
    }
}